

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TrackedSection * __thiscall
Catch::SectionTracking::TrackedSection::acquireChild(TrackedSection *this,string *childName)

{
  TrackedSections *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  iterator iVar3;
  TrackedSection *pTVar4;
  TrackedSection local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>
  local_b0;
  
  this_00 = &this->m_children;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
          ::find(&this_00->_M_t,childName);
  p_Var1 = &(this->m_children)._M_t._M_impl.super__Rb_tree_header;
  pTVar4 = (TrackedSection *)(iVar3._M_node + 2);
  if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
    local_110.m_name._M_dataplus._M_p = (pointer)&local_110.m_name.field_2;
    pcVar2 = (childName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar2,pcVar2 + childName->_M_string_length);
    local_110.m_runState = NotStarted;
    local_110.m_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_110.m_children._M_t._M_impl.super__Rb_tree_header._M_header;
    local_110.m_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_110.m_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_110.m_children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_110.m_children._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_110.m_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_110.m_parent = this;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>
    ::pair<Catch::SectionTracking::TrackedSection,_true>(&local_b0,childName,&local_110);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::SectionTracking::TrackedSection>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>>
                *)this_00,&local_b0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
    ::~_Rb_tree(&local_b0.second.m_children._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.m_name._M_dataplus._M_p != &local_b0.second.m_name.field_2) {
      operator_delete(local_b0.second.m_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
      operator_delete(local_b0.first._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
    ::~_Rb_tree(&local_110.m_children._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.m_name._M_dataplus._M_p != &local_110.m_name.field_2) {
      operator_delete(local_110.m_name._M_dataplus._M_p);
    }
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>_>_>
            ::find(&this_00->_M_t,childName);
    pTVar4 = (TrackedSection *)0x0;
    if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
      pTVar4 = (TrackedSection *)(iVar3._M_node + 2);
    }
  }
  return pTVar4;
}

Assistant:

inline TrackedSection* TrackedSection::acquireChild( std::string const& childName ) {
        if( TrackedSection* child = findChild( childName ) )
            return child;
        m_children.insert( std::make_pair( childName, TrackedSection( childName, this ) ) );
        return findChild( childName );
    }